

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_builder.c
# Opt level: O2

void AstBuilder_build(Builder *builder,Token_conflict *token)

{
  AstNode *pAVar1;
  
  if (token->matched_type == Token_Comment) {
    ItemQueue_add((ItemQueue *)builder[1].set_error_context,(Item *)token);
    return;
  }
  pAVar1 = current_node((AstBuilder *)builder);
  if (pAVar1 != (AstNode *)0x0) {
    pAVar1 = current_node((AstBuilder *)builder);
    AstNode_add(pAVar1,token->matched_type,token);
    return;
  }
  return;
}

Assistant:

void AstBuilder_build(Builder* builder, Token* token) {
    if ((RuleType)token->matched_type == Rule_Comment) {
        ItemQueue_add(((AstBuilder*)builder)->comments, (Item*)token);
    }
    else if (current_node((AstBuilder*)builder)) {
        AstNode_add(current_node((AstBuilder*)builder), (RuleType)token->matched_type, token);
    }
}